

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getmodel.cpp
# Opt level: O3

void __thiscall getmodel::doCdfInnerNoIntensityUncertaintyz(getmodel *this,FILE *fin,int event_id)

{
  _Rb_tree_header *p_Var1;
  AREAPERIL_INT AVar2;
  long lVar3;
  pointer puVar4;
  uint uVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  int extraout_EDX;
  int iVar9;
  FILE *__stream;
  getmodel *this_00;
  int iVar10;
  AREAPERIL_INT *areaperil_id;
  uLong dest_length;
  key_type kStack_94;
  map<unsigned_int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *pmStack_90;
  AREAPERIL_INT AStack_84;
  int iStack_80;
  getmodel *pgStack_78;
  key_type *pkStack_70;
  int local_3c;
  ulong local_38;
  
  p_Var7 = (this->_event_index_by_event_id)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var7 != (_Base_ptr)0x0) {
    p_Var1 = &(this->_event_index_by_event_id)._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = &p_Var1->_M_header;
    do {
      if (event_id <= (int)p_Var7[1]._M_color) {
        p_Var8 = p_Var7;
      }
      p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < event_id];
    } while (p_Var7 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var8 != p_Var1) && ((int)p_Var8[1]._M_color <= event_id)) {
      local_3c = event_id;
      pmVar6 = std::
               map<int,_EventIndex,_std::less<int>,_std::allocator<std::pair<const_int,_EventIndex>_>_>
               ::operator[](&this->_event_index_by_event_id,&local_3c);
      fseek((FILE *)fin,pmVar6->offset,0);
      pmVar6 = std::
               map<int,_EventIndex,_std::less<int>,_std::allocator<std::pair<const_int,_EventIndex>_>_>
               ::operator[](&this->_event_index_by_event_id,&local_3c);
      lVar3 = pmVar6->size;
      iVar9 = (int)lVar3;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->_compressed_buf,(long)(iVar9 + 1));
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&this->_uncompressed_buf,(lVar3 << 0x22) * 5 >> 0x20);
      fread((this->_compressed_buf).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start,(long)iVar9,1,(FILE *)fin);
      puVar4 = (this->_uncompressed_buf).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_38 = (long)(this->_uncompressed_buf).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)puVar4;
      __stream = (FILE *)&stack0xffffffffffffffc8;
      uVar5 = uncompress(puVar4,__stream,
                         (this->_compressed_buf).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start,(long)iVar9);
      if (uVar5 != 0) {
        this_00 = (getmodel *)(ulong)uVar5;
        doCdfInnerNoIntensityUncertaintyz(this_00);
        p_Var7 = (this_00->_event_index_by_event_id)._M_t._M_impl.super__Rb_tree_header._M_header.
                 _M_parent;
        if (p_Var7 != (_Base_ptr)0x0) {
          p_Var1 = &(this_00->_event_index_by_event_id)._M_t._M_impl.super__Rb_tree_header;
          p_Var8 = &p_Var1->_M_header;
          do {
            if (extraout_EDX <= (int)p_Var7[1]._M_color) {
              p_Var8 = p_Var7;
            }
            p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < extraout_EDX];
          } while (p_Var7 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var8 != p_Var1) && ((int)p_Var8[1]._M_color <= extraout_EDX)) {
            pgStack_78 = this;
            pkStack_70 = &local_3c;
            pmVar6 = std::
                     map<int,_EventIndex,_std::less<int>,_std::allocator<std::pair<const_int,_EventIndex>_>_>
                     ::operator[](&this_00->_event_index_by_event_id,&kStack_94);
            iVar9 = 0;
            fseek(__stream,pmVar6->offset,0);
            pmVar6 = std::
                     map<int,_EventIndex,_std::less<int>,_std::allocator<std::pair<const_int,_EventIndex>_>_>
                     ::operator[](&this_00->_event_index_by_event_id,&kStack_94);
            iVar10 = (int)((ulong)pmVar6->size / 0xc);
            if (0 < iVar10) {
              p_Var1 = &(this_00->_area_perils)._M_t._M_impl.super__Rb_tree_header;
              pmStack_90 = &this_00->_vulnerability_ids_by_area_peril;
              do {
                fread(&AStack_84,0xc,1,__stream);
                p_Var7 = (this_00->_area_perils)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_parent;
                p_Var8 = &p_Var1->_M_header;
                if (p_Var7 != (_Base_ptr)0x0) {
                  do {
                    if ((int)AStack_84 <= (int)*(size_t *)(p_Var7 + 1)) {
                      p_Var8 = p_Var7;
                    }
                    p_Var7 = (&p_Var7->_M_left)[(int)*(size_t *)(p_Var7 + 1) < (int)AStack_84];
                  } while (p_Var7 != (_Base_ptr)0x0);
                  if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
                     ((int)((_Rb_tree_header *)p_Var8)->_M_node_count <= (int)AStack_84)) {
                    doResultsNoIntensityUncertainty
                              (this_00,&kStack_94,&AStack_84,pmStack_90,&this_00->_vulnerabilities,
                               iStack_80);
                  }
                }
                iVar9 = iVar9 + 1;
              } while (iVar9 != iVar10);
            }
          }
        }
        return;
      }
      iVar9 = (int)(local_38 / 0xc);
      if (0 < iVar9) {
        areaperil_id = (AREAPERIL_INT *)
                       (this->_uncompressed_buf).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        p_Var1 = &(this->_area_perils)._M_t._M_impl.super__Rb_tree_header;
        iVar10 = 0;
        do {
          p_Var7 = (this->_area_perils)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var7 != (_Base_ptr)0x0) {
            AVar2 = *areaperil_id;
            p_Var8 = &p_Var1->_M_header;
            do {
              if ((int)AVar2 <= (int)*(size_t *)(p_Var7 + 1)) {
                p_Var8 = p_Var7;
              }
              p_Var7 = (&p_Var7->_M_left)[(int)*(size_t *)(p_Var7 + 1) < (int)AVar2];
            } while (p_Var7 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
               ((int)((_Rb_tree_header *)p_Var8)->_M_node_count <= (int)AVar2)) {
              doResultsNoIntensityUncertainty
                        (this,&local_3c,areaperil_id,&this->_vulnerability_ids_by_area_peril,
                         &this->_vulnerabilities,areaperil_id[1]);
            }
          }
          areaperil_id = areaperil_id + 3;
          iVar10 = iVar10 + 1;
        } while (iVar10 != iVar9);
      }
    }
  }
  return;
}

Assistant:

void getmodel::doCdfInnerNoIntensityUncertaintyz(FILE* fin, int event_id) {
  auto sizeof_EventKey = sizeof(EventRow);
  if (_event_index_by_event_id.count(event_id) == 0)
    return;
  flseek(fin, _event_index_by_event_id[event_id].offset, 0);
  int size = _event_index_by_event_id[event_id].size;
  _compressed_buf.resize(size + 1);
  _uncompressed_buf.resize(size * 20);
  fread(&_compressed_buf[0], size, 1, fin);
  uLong dest_length = _uncompressed_buf.size();
  int ret = uncompress(&_uncompressed_buf[0], &dest_length,
                        &_compressed_buf[0], size);
  if (ret != Z_OK) {
    fprintf(stderr, "FATAL: Got bad return code from uncompress %d\n", ret);
    exit(-1);
  }    
  // we now have the data length
  int number_of_event_records =
      static_cast<int>(dest_length / sizeof_EventKey);
  EventRow *event_key = (EventRow *)&_uncompressed_buf[0];
  for (int i = 0; i < number_of_event_records; i++) {
    bool do_cdf_for_area_peril =
        (_area_perils.count(event_key->areaperil_id) == 1);
    if (do_cdf_for_area_peril) {
      // Generate and write the results
      doResultsNoIntensityUncertainty(
          event_id, event_key->areaperil_id, _vulnerability_ids_by_area_peril,
          _vulnerabilities, event_key->intensity_bin_id);
    }
    event_key++;
  }
}